

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_Combos_Test::TestBody(unitStrings_Combos_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unit_data uVar2;
  precise_unit *ppVar3;
  char *pcVar4;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper local_40;
  unit_data local_38;
  undefined4 local_34;
  string local_30;
  
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&units::V + 4),(unit_data *)((long)&units::km + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_40.data_ = (AssertHelperData *)0x3f50624de0000000;
  local_34 = 0;
  local_38 = uVar2;
  units::to_string_abi_cxx11_(&local_30,(units *)&local_40,ppVar3,0x3f50624de0000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_50,"to_string(V / km)","\"mV/m\"",&local_30,(char (*) [5])"mV/m");
  paVar1 = &local_30.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x42,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&units::currency + 4),(unit_data *)((long)&units::MWh + 4))
  ;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_40.data_ = (AssertHelperData *)0x3df316b7e0000000;
  local_34 = 0;
  local_38 = uVar2;
  units::to_string_abi_cxx11_(&local_30,(units *)&local_40,ppVar3,0x3df316b7e0000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            (local_50,"to_string(currency / MWh)","\"$/MWh\"",&local_30,(char (*) [6])"$/MWh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x43,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&units::currency + 4),(unit_data *)((long)&units::mile + 4)
                    );
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_40.data_ = (AssertHelperData *)0x3f445c7080000000;
  local_34 = 0;
  local_38 = uVar2;
  units::to_string_abi_cxx11_(&local_30,(units *)&local_40,ppVar3,0x3f445c7080000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_50,"to_string(currency / mile)","\"$/mi\"",&local_30,(char (*) [5])"$/mi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x44,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&units::kW + 4),(unit_data *)((long)&units::gal + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_40.data_ = (AssertHelperData *)0x41101fb040000000;
  local_34 = 0;
  local_38 = uVar2;
  units::to_string_abi_cxx11_(&local_30,(units *)&local_40,ppVar3,0x41101fb040000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            (local_50,"to_string(kW / gal)","\"kW/gal\"",&local_30,(char (*) [7])"kW/gal");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x45,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST(stringToUnits, barrels)
{
    EXPECT_EQ(
        precise::kilo * precise::us::barrel / precise::day,
        unit_from_string("kbbl (US)/d"));
}